

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RuntimeFunction.cpp
# Opt level: O2

SnapObjectType __thiscall Js::RuntimeFunction::GetSnapTag_TTD(RuntimeFunction *this)

{
  int iVar1;
  undefined8 local_10;
  Var revokableProxy;
  
  local_10 = 0;
  iVar1 = (*(this->super_JavascriptFunction).super_DynamicObject.super_RecyclableObject.
            super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x14])
                    (this,this,0xd,&local_10,0,
                     (((((this->super_JavascriptFunction).super_DynamicObject.super_RecyclableObject
                         .type.ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
                     scriptContext.ptr);
  return (uint)(iVar1 != 0) * 2 + SnapRuntimeFunctionObject;
}

Assistant:

TTD::NSSnapObjects::SnapObjectType RuntimeFunction::GetSnapTag_TTD() const
    {
        Var revokableProxy = nullptr;
        RuntimeFunction* function = const_cast<RuntimeFunction*>(this);
        if(function->GetInternalProperty(function, Js::InternalPropertyIds::RevocableProxy, &revokableProxy, nullptr, this->GetScriptContext()))
        {
            return TTD::NSSnapObjects::SnapObjectType::SnapRuntimeRevokerFunctionObject;
        }
        else
        {
            return TTD::NSSnapObjects::SnapObjectType::SnapRuntimeFunctionObject;
        }
    }